

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

void qtree_expand(uchar *infile,uchar *a,int nx,int ny,uchar *b)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  uchar *in_RSI;
  uchar *in_R8;
  int i;
  int local_24;
  
  qtree_copy(in_RSI,in_EDX,in_ECX,in_R8,in_ECX);
  local_24 = in_EDX * in_ECX;
  while (local_24 = local_24 + -1, -1 < local_24) {
    if (in_R8[local_24] != '\0') {
      iVar1 = input_huffman((uchar *)CONCAT44(in_EDX,in_ECX));
      in_R8[local_24] = (uchar)iVar1;
    }
  }
  return;
}

Assistant:

static void
qtree_expand(unsigned char *infile, unsigned char a[], int nx, int ny, unsigned char b[])
{
int i;

	/*
	 * first copy a to b, expanding each 4-bit value
	 */
	qtree_copy(a,nx,ny,b,ny);
	/*
	 * now read new 4-bit values into b for each non-zero element
	 */
	for (i = nx*ny-1; i >= 0; i--) {
		if (b[i]) b[i] = input_huffman(infile);
	}
}